

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

type CLI::detail::checked_multiply<int>(int *a,int b)

{
  int iVar1;
  int iVar2;
  type_conflict tVar3;
  int in_ESI;
  int *in_RDI;
  int *in_stack_ffffffffffffffd8;
  type local_1;
  
  if ((((*in_RDI == 0) || (in_ESI == 0)) || (*in_RDI == 1)) || (in_ESI == 1)) {
    *in_RDI = in_ESI * *in_RDI;
    local_1 = true;
  }
  else {
    iVar2 = *in_RDI;
    iVar1 = std::numeric_limits<int>::min();
    if ((iVar2 != iVar1) && (iVar2 = std::numeric_limits<int>::min(), in_ESI != iVar2)) {
      tVar3 = overflowCheck<int>(in_stack_ffffffffffffffd8,(int *)0x13ca2b);
      if (tVar3 != 0) {
        return false;
      }
      *in_RDI = in_ESI * *in_RDI;
      return true;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type checked_multiply(T &a, T b) {
    if(a == 0 || b == 0 || a == 1 || b == 1) {
        a *= b;
        return true;
    }
    if(a == (std::numeric_limits<T>::min)() || b == (std::numeric_limits<T>::min)()) {
        return false;
    }
    if(overflowCheck(a, b)) {
        return false;
    }
    a *= b;
    return true;
}